

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

Metric * __thiscall
hta::Directory::make_metric
          (Metric *__return_storage_ptr__,Directory *this,string *name,json *config)

{
  _Head_base<0UL,_hta::storage::Directory_*,_false> _Var1;
  bool bVar2;
  size_type sVar3;
  const_reference this_00;
  runtime_error *this_01;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uStackY_100;
  allocator<char> local_d1;
  _Head_base<0UL,_hta::storage::Metric_*,_false> local_d0;
  key_type local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mode_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Meta local_48;
  
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[5]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [5])"mode");
  if (sVar3 == 0) {
    uStackY_100 = 2;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"mode",(allocator<char> *)&local_88);
    this_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::at(config,&local_c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&mode_str,this_00);
    std::__cxx11::string::~string((string *)&local_c8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mode_str,"RW");
    if (bVar2) {
      uStackY_100 = 2;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mode_str,"R");
      uStackY_100 = 0;
      if (!bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&mode_str,"W");
        if (!bVar2) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"unknown metric mode ",&local_d1);
          std::operator+(&local_88,&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &mode_str);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c8,&local_88," supported modes are RW,R,W");
          std::runtime_error::runtime_error(this_01,(string *)&local_c8);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uStackY_100 = 1;
      }
    }
    std::__cxx11::string::~string((string *)&mode_str);
  }
  _Var1._M_head_impl =
       (this->directory_)._M_t.
       super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>
       ._M_t.
       super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>
       .super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl;
  Meta::Meta(&local_48,config);
  (**(_Var1._M_head_impl)->_vptr_Directory)
            (&local_d0,_Var1._M_head_impl,name,uStackY_100,in_R8,in_R9,
             (undefined4)local_48.interval_min.__r,(undefined4)local_48.interval_max.__r,
             local_48.interval_factor);
  Metric::Metric(__return_storage_ptr__,
                 (unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_> *)
                 &local_d0);
  if (local_d0._M_head_impl != (Metric *)0x0) {
    (*(local_d0._M_head_impl)->_vptr_Metric[0xe])();
  }
  return __return_storage_ptr__;
}

Assistant:

Metric Directory::make_metric(const std::string& name, const hta::json& config)
{
    Mode mode = Mode::read_write;
    if (config.count("mode"))
    {
        auto mode_str = config.at("mode").get<std::string>();
        if (mode_str == "RW")
        {
            mode = Mode::read_write;
        }
        else if (mode_str == "R")
        {
            mode = Mode::read;
        }
        else if (mode_str == "W")
        {
            mode = Mode::write;
        }
        else
        {
            throw std::runtime_error(std::string("unknown metric mode ") + mode_str +
                                     " supported modes are RW,R,W");
        }
    }
    return Metric(directory_->open(name, mode, Meta(config)));
}